

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

Vec_Int_t * Emb_ManDumpGnuplotPrepare(Emb_Man_t *p)

{
  int *piVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  void *__ptr;
  void *__ptr_00;
  long lVar5;
  Vec_Int_t *p_00;
  char cVar6;
  void *pvVar7;
  long lVar8;
  
  __ptr = calloc(0x55924,1);
  __ptr_00 = malloc(4000);
  pvVar7 = __ptr;
  for (lVar5 = 0; lVar5 != 500; lVar5 = lVar5 + 1) {
    *(void **)((long)__ptr_00 + lVar5 * 8) = pvVar7;
    pvVar7 = (void *)((long)pvVar7 + 0x2bd);
  }
  uVar4 = 0;
  while (((int)uVar4 < p->nObjData && (piVar1 = p->pObjData, piVar1 != (int *)0x0))) {
    *(undefined1 *)
     (*(long *)((long)__ptr_00 +
               (ulong)((uint)p->pPlacement[(ulong)(uint)(piVar1[(ulong)uVar4 + 4] * 2) + 1] * 500 >>
                      0x10) * 8) +
     (ulong)((uint)p->pPlacement[(uint)(piVar1[(ulong)uVar4 + 4] * 2)] * 700 >> 0x10)) = 1;
    uVar4 = piVar1[(ulong)uVar4 + 1] + ((uint)piVar1[uVar4] >> 4) + uVar4 + 5;
  }
  p_00 = Vec_IntAlloc(1000);
  lVar5 = 0;
  do {
    if (lVar5 == 500) {
      free(__ptr);
      free(__ptr_00);
      return p_00;
    }
    lVar2 = *(long *)((long)__ptr_00 + lVar5 * 8);
    bVar3 = false;
    for (lVar8 = 0; lVar8 != 0x2bd; lVar8 = lVar8 + 1) {
      cVar6 = *(char *)(lVar2 + lVar8);
      if (!bVar3 && cVar6 != '\0') {
        Vec_IntPush(p_00,(int)lVar8);
        Vec_IntPush(p_00,(int)lVar5);
        cVar6 = *(char *)(lVar2 + lVar8);
        bVar3 = true;
      }
      if (bVar3 && cVar6 == '\0') {
        Vec_IntPush(p_00,(int)lVar8 + -1);
        Vec_IntPush(p_00,(int)lVar5);
        bVar3 = false;
      }
    }
    lVar5 = lVar5 + 1;
  } while (!bVar3);
  __assert_fail("fStart == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                ,0x68d,"Vec_Int_t *Emb_ManDumpGnuplotPrepare(Emb_Man_t *)");
}

Assistant:

Vec_Int_t * Emb_ManDumpGnuplotPrepare( Emb_Man_t * p )
{
//    int nRows = 496;
//    int nCols = 710;
    int nRows = 500;
    int nCols = 700;
    Vec_Int_t * vLines;
    Emb_Obj_t * pThis;
    char * pBuffer, ** ppRows;
    int i, k, placeX, placeY;
    int fStart;
    // alloc memory
    pBuffer = ABC_CALLOC( char, nRows * (nCols+1) );
    ppRows  = ABC_ALLOC( char *, nRows );
    for ( i = 0; i < nRows; i++ )
        ppRows[i] = pBuffer + i*(nCols+1);
    // put data into them
    Emb_ManForEachObj( p, pThis, i )
    {
        placeX = p->pPlacement[2*pThis->Value+0] * nCols / (1<<16);
        placeY = p->pPlacement[2*pThis->Value+1] * nRows / (1<<16);
        assert( placeX < nCols && placeY < nRows );
        ppRows[placeY][placeX] = 1;
    }
    // select lines
    vLines = Vec_IntAlloc( 1000 );
    for ( i = 0; i < nRows; i++ )
    {
        fStart = 0;
        for ( k = 0; k <= nCols; k++ )
        {
            if ( ppRows[i][k] && !fStart )
            {
                Vec_IntPush( vLines, k );
                Vec_IntPush( vLines, i );
                fStart = 1;
            }
            if ( !ppRows[i][k] && fStart )
            {
                Vec_IntPush( vLines, k-1 );
                Vec_IntPush( vLines, i );
                fStart = 0;
            }
        }
        assert( fStart == 0 );
    }
    ABC_FREE( pBuffer );
    ABC_FREE( ppRows );
    return vLines;
}